

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_get_object_item_case_sensitive_should_get_object_items(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_Parse("{\"one\":1, \"Two\":2, \"tHree\":3}");
  pcVar1 = cJSON_GetObjectItemCaseSensitive((cJSON *)0x0,"test");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail("Failed to fail on NULL pointer.");
  }
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,(char *)0x0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail("Failed to fail on NULL string.",0x6e);
  }
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"one");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail("Failed to find first item.",0x71);
  }
  UnityAssertDoublesWithin
            (pcVar1->valuedouble * 1e-12,pcVar1->valuedouble,0x3ff0000000000000,0,0x72);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"Two");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail("Failed to find first item.",0x75);
  }
  UnityAssertDoublesWithin
            (pcVar1->valuedouble * 1e-12,pcVar1->valuedouble,0x4000000000000000,0,0x76);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"tHree");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail("Failed to find item.",0x79);
  }
  UnityAssertDoublesWithin
            (pcVar1->valuedouble * 1e-12,pcVar1->valuedouble,0x4008000000000000,0,0x7a);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"One");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail("Should not find something that isn\'t there.",0x7d);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_get_object_item_case_sensitive_should_get_object_items(void)
{
    cJSON *item = NULL;
    cJSON *found = NULL;

    item = cJSON_Parse("{\"one\":1, \"Two\":2, \"tHree\":3}");

    found = cJSON_GetObjectItemCaseSensitive(NULL, "test");
    TEST_ASSERT_NULL_MESSAGE(found, "Failed to fail on NULL pointer.");

    found = cJSON_GetObjectItemCaseSensitive(item, NULL);
    TEST_ASSERT_NULL_MESSAGE(found, "Failed to fail on NULL string.");

    found = cJSON_GetObjectItemCaseSensitive(item, "one");
    TEST_ASSERT_NOT_NULL_MESSAGE(found, "Failed to find first item.");
    TEST_ASSERT_EQUAL_DOUBLE(found->valuedouble, 1);

    found = cJSON_GetObjectItemCaseSensitive(item, "Two");
    TEST_ASSERT_NOT_NULL_MESSAGE(found, "Failed to find first item.");
    TEST_ASSERT_EQUAL_DOUBLE(found->valuedouble, 2);

    found = cJSON_GetObjectItemCaseSensitive(item, "tHree");
    TEST_ASSERT_NOT_NULL_MESSAGE(found, "Failed to find item.");
    TEST_ASSERT_EQUAL_DOUBLE(found->valuedouble, 3);

    found = cJSON_GetObjectItemCaseSensitive(item, "One");
    TEST_ASSERT_NULL_MESSAGE(found, "Should not find something that isn't there.");

    cJSON_Delete(item);
}